

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

ptls_aead_context_t *
create_ech_opener(ptls_ech_create_opener_t *self,ptls_hpke_kem_t **kem,
                 ptls_hpke_cipher_suite_t **cipher,ptls_t *tls,uint8_t config_id,
                 ptls_hpke_cipher_suite_id_t cipher_id,ptls_iovec_t enc,ptls_iovec_t info_prefix)

{
  ptls_iovec_t info;
  int iVar1;
  BIO *bp;
  EVP_PKEY *pkey;
  ptls_hpke_cipher_suite_t *ppVar2;
  ptls_hpke_cipher_suite_t **pppVar3;
  ptls_aead_context_t *local_58;
  ptls_buffer_t local_50;
  uint8_t *local_30;
  size_t sStack_28;
  
  if (create_ech_opener::pem == (ptls_key_exchange_context_t *)0x0) {
    bp = BIO_new_mem_buf("-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQg885/2uV+GjENh/Hr\nvebzKL4Kmc28rfTWWJzyneS4/9KhRANCAAT+jBnOCQUZHrwpipJFeSUx8m8M7OJG\nBjnovDnLf3Bqgmp3m0z5abig5TnH9i+z0wrWqo+A4w8dEoqv1oos5y6g\n-----END PRIVATE KEY-----\n"
                         ,0xf1);
    pkey = PEM_read_bio_PrivateKey(bp,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
    if (pkey == (EVP_PKEY *)0x0) {
      __assert_fail("pkey != NULL && \"failed to load private key\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",
                    0x106,"ptls_key_exchange_context_t *key_from_pem(const char *)");
    }
    BIO_free(bp);
    iVar1 = ptls_openssl_create_key_exchange
                      ((ptls_key_exchange_context_t **)&local_50,(EVP_PKEY *)pkey);
    if (iVar1 != 0) {
      __assert_fail("ret == 0 && \"failed to setup private key\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",
                    0x10b,"ptls_key_exchange_context_t *key_from_pem(const char *)");
    }
    EVP_PKEY_free(pkey);
    create_ech_opener::pem = (ptls_key_exchange_context_t *)local_50.base;
    if ((ptls_key_exchange_context_t *)local_50.base == (ptls_key_exchange_context_t *)0x0) {
      __assert_fail("pem != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",
                    0x15d,
                    "ptls_aead_context_t *create_ech_opener(ptls_ech_create_opener_t *, ptls_hpke_kem_t **, ptls_hpke_cipher_suite_t **, ptls_t *, uint8_t, ptls_hpke_cipher_suite_id_t, ptls_iovec_t, ptls_iovec_t)"
                   );
    }
  }
  *cipher = (ptls_hpke_cipher_suite_t *)0x0;
  if (ptls_openssl_hpke_cipher_suites[0] != (ptls_hpke_cipher_suite_t *)0x0) {
    pppVar3 = ptls_openssl_hpke_cipher_suites;
    ppVar2 = ptls_openssl_hpke_cipher_suites[0];
    do {
      pppVar3 = pppVar3 + 1;
      if (((ppVar2->id).kdf == cipher_id.kdf) &&
         ((uint)cipher_id >> 0x10 == (uint)(ppVar2->id).aead)) {
        *cipher = ppVar2;
        local_58 = (ptls_aead_context_t *)0x0;
        local_50.base = "";
        local_50.capacity = 0;
        local_50.off = 0;
        local_50.is_allocated = '\0';
        local_50.align_bits = '\0';
        iVar1 = ptls_buffer__do_pushv(&local_50,info_prefix.base,info_prefix.len);
        if ((iVar1 == 0) &&
           (iVar1 = ptls_buffer__do_pushv(&local_50,(char *)0x13dd52,99), iVar1 == 0)) {
          local_30 = local_50.base;
          sStack_28 = local_50.off;
          info.len = local_50.off;
          info.base = local_50.base;
          ptls_hpke_setup_base_r
                    (&ptls_openssl_hpke_kem_p256sha256,*cipher,create_ech_opener::pem,&local_58,enc,
                     info);
        }
        ptls_buffer__release_memory(&local_50);
        return local_58;
      }
      ppVar2 = *pppVar3;
    } while (ppVar2 != (ptls_hpke_cipher_suite_t *)0x0);
  }
  return (ptls_aead_context_t *)0x0;
}

Assistant:

static ptls_aead_context_t *create_ech_opener(ptls_ech_create_opener_t *self, ptls_hpke_kem_t **kem,
                                              ptls_hpke_cipher_suite_t **cipher, ptls_t *tls, uint8_t config_id,
                                              ptls_hpke_cipher_suite_id_t cipher_id, ptls_iovec_t enc, ptls_iovec_t info_prefix)
{
    static ptls_key_exchange_context_t *pem = NULL;
    if (pem == NULL) {
        pem = key_from_pem(ECH_PRIVATE_KEY);
        assert(pem != NULL);
    }

    *cipher = NULL;
    for (size_t i = 0; ptls_openssl_hpke_cipher_suites[i] != NULL; ++i) {
        if (ptls_openssl_hpke_cipher_suites[i]->id.kdf == cipher_id.kdf &&
            ptls_openssl_hpke_cipher_suites[i]->id.aead == cipher_id.aead) {
            *cipher = ptls_openssl_hpke_cipher_suites[i];
            break;
        }
    }
    if (*cipher == NULL)
        return NULL;

    ptls_aead_context_t *aead = NULL;
    ptls_buffer_t infobuf;
    int ret;

    ptls_buffer_init(&infobuf, "", 0);
    ptls_buffer_pushv(&infobuf, info_prefix.base, info_prefix.len);
    ptls_buffer_pushv(&infobuf, (const uint8_t *)ECH_CONFIG_LIST + 2,
                      sizeof(ECH_CONFIG_LIST) - 3); /* choose the only ECHConfig from the list */
    ret = ptls_hpke_setup_base_r(&ptls_openssl_hpke_kem_p256sha256, *cipher, pem, &aead, enc,
                                 ptls_iovec_init(infobuf.base, infobuf.off));

Exit:
    ptls_buffer_dispose(&infobuf);
    return aead;
}